

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  Db *pDVar4;
  char *pcVar5;
  uint uVar6;
  HashElem *pHVar7;
  long lVar8;
  uint uVar9;
  
  uVar3 = db->nDb;
LAB_0015957b:
  if (0 < (int)uVar3) {
    pDVar4 = db->aDb;
    uVar9 = 0;
    do {
      uVar6 = uVar9 < 2 ^ uVar9;
      if (zDatabase != (char *)0x0) {
        lVar8 = 0;
        do {
          bVar1 = zDatabase[lVar8];
          bVar2 = pDVar4[uVar6].zDbSName[lVar8];
          if (bVar1 == bVar2) {
            if ((ulong)bVar1 == 0) break;
          }
          else if (""[bVar1] != ""[bVar2]) goto LAB_001595ef;
          lVar8 = lVar8 + 1;
        } while( true );
      }
      pHVar7 = findElementWithHash(&(pDVar4[uVar6].pSchema)->tblHash,zName,(uint *)0x0);
      if ((Table *)pHVar7->data != (Table *)0x0) {
        return (Table *)pHVar7->data;
      }
LAB_001595ef:
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar3);
  }
  lVar8 = 0;
  do {
    bVar1 = zName[lVar8];
    if (bVar1 == "sqlite_master"[lVar8]) {
      if ((ulong)bVar1 == 0) break;
    }
    else if (""[bVar1] != ""[(byte)"sqlite_master"[lVar8]]) {
      return (Table *)0x0;
    }
    lVar8 = lVar8 + 1;
  } while( true );
  pcVar5 = db->aDb[1].zDbSName;
  if (zDatabase != (char *)0x0) {
    if (pcVar5 == (char *)0x0) {
      return (Table *)0x0;
    }
    lVar8 = 0;
    do {
      bVar1 = zDatabase[lVar8];
      if (bVar1 == pcVar5[lVar8]) {
        if ((ulong)bVar1 == 0) goto LAB_00159670;
      }
      else if (""[bVar1] != ""[(byte)pcVar5[lVar8]]) {
        return (Table *)0x0;
      }
      lVar8 = lVar8 + 1;
    } while( true );
  }
  zName = "sqlite_temp_master";
  if (pcVar5 != (char *)0x0) {
    return (Table *)0x0;
  }
  goto LAB_0015957b;
LAB_00159670:
  zName = "sqlite_temp_master";
  goto LAB_0015957b;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;

  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
#if SQLITE_USER_AUTHENTICATION
  /* Only the admin user is allowed to know that the sqlite_user table
  ** exists */
  if( db->auth.authLevel<UAUTH_Admin && sqlite3UserAuthTable(zName)!=0 ){
    return 0;
  }
#endif
  while(1){
    for(i=OMIT_TEMPDB; i<db->nDb; i++){
      int j = (i<2) ? i^1 : i;   /* Search TEMP before MAIN */
      if( zDatabase==0 || sqlite3StrICmp(zDatabase, db->aDb[j].zDbSName)==0 ){
        assert( sqlite3SchemaMutexHeld(db, j, 0) );
        p = sqlite3HashFind(&db->aDb[j].pSchema->tblHash, zName);
        if( p ) return p;
      }
    }
    /* Not found.  If the name we were looking for was temp.sqlite_master
    ** then change the name to sqlite_temp_master and try again. */
    if( sqlite3StrICmp(zName, MASTER_NAME)!=0 ) break;
    if( sqlite3_stricmp(zDatabase, db->aDb[1].zDbSName)!=0 ) break;
    zName = TEMP_MASTER_NAME;
  }
  return 0;
}